

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGProcessExternalRef(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  uint uVar1;
  void *pvVar2;
  xmlRelaxNGGrammarPtr_conflict pxVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlNodePtr node_00;
  xmlChar *value;
  xmlRelaxNGPtr pxVar5;
  xmlHashTablePtr pxVar6;
  bool bVar7;
  
  pvVar2 = node->psvi;
  if ((pvVar2 == (void *)0x0) ||
     (pxVar4 = xmlRelaxNGNewDefine(ctxt,node), pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0)) {
    return (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  pxVar4->type = XML_RELAXNG_EXTERNALREF;
  if (*(long *)((long)pvVar2 + 0x18) != 0) goto LAB_00175a7d;
  node_00 = xmlDocGetRootElement(*(xmlDoc **)((long)pvVar2 + 0x10));
  if (node_00 == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,node,0x407,"xmlRelaxNGParse: %s is empty\n",ctxt->URL,(xmlChar *)0x0);
    return (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  value = xmlGetProp(node_00,"ns");
  bVar7 = value == (xmlChar *)0x0;
  if (bVar7) {
    do {
      if (node->type != XML_ELEMENT_NODE) break;
      value = xmlGetProp(node,"ns");
      if (value != (xmlChar *)0x0) {
        xmlSetProp(node_00,"ns",value);
        goto LAB_00175acc;
      }
      node = node->parent;
    } while (node != (_xmlNode *)0x0);
    bVar7 = false;
  }
  else {
LAB_00175acc:
    (*xmlFree)(value);
  }
  uVar1 = ctxt->flags;
  ctxt->flags = uVar1 | 0x80;
  pxVar5 = xmlRelaxNGParseDocument(ctxt,node_00);
  *(xmlRelaxNGPtr *)((long)pvVar2 + 0x20) = pxVar5;
  ctxt->flags = uVar1;
  if ((pxVar5 != (xmlRelaxNGPtr)0x0) &&
     (pxVar3 = pxVar5->topgrammar, pxVar3 != (xmlRelaxNGGrammarPtr_conflict)0x0)) {
    *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar2 + 0x18) = pxVar3->start;
    pxVar6 = pxVar3->refs;
    if ((pxVar6 != (xmlHashTablePtr)0x0) && (ctxt->grammar != (xmlRelaxNGGrammarPtr_conflict)0x0)) {
      if (ctxt->grammar->refs == (xmlHashTablePtr)0x0) {
        pxVar6 = xmlHashCreate(10);
        ctxt->grammar->refs = pxVar6;
        if (pxVar6 == (xmlHashTablePtr)0x0) {
          xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x44a,"Could not create references hash\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
          goto LAB_00175bb7;
        }
        pxVar6 = pxVar3->refs;
      }
      xmlHashScan(pxVar6,xmlRelaxNGParseImportRef,ctxt);
    }
  }
LAB_00175bb7:
  if (bVar7) {
    xmlUnsetProp(node_00,"ns");
  }
LAB_00175a7d:
  pxVar4->content = *(xmlRelaxNGDefinePtr *)((long)pvVar2 + 0x18);
  return pxVar4;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGProcessExternalRef(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDocumentPtr docu;
    xmlNodePtr root, tmp;
    xmlChar *ns;
    int newNs = 0, oldflags;
    xmlRelaxNGDefinePtr def;

    docu = node->psvi;
    if (docu != NULL) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_EXTERNALREF;

        if (docu->content == NULL) {
            /*
             * Then do the parsing for good
             */
            root = xmlDocGetRootElement(docu->doc);
            if (root == NULL) {
                xmlRngPErr(ctxt, node, XML_RNGP_EXTERNALREF_EMTPY,
                           "xmlRelaxNGParse: %s is empty\n", ctxt->URL,
                           NULL);
                return (NULL);
            }
            /*
             * ns transmission rules
             */
            ns = xmlGetProp(root, BAD_CAST "ns");
            if (ns == NULL) {
                tmp = node;
                while ((tmp != NULL) && (tmp->type == XML_ELEMENT_NODE)) {
                    ns = xmlGetProp(tmp, BAD_CAST "ns");
                    if (ns != NULL) {
                        break;
                    }
                    tmp = tmp->parent;
                }
                if (ns != NULL) {
                    xmlSetProp(root, BAD_CAST "ns", ns);
                    newNs = 1;
                    xmlFree(ns);
                }
            } else {
                xmlFree(ns);
            }

            /*
             * Parsing to get a precompiled schemas.
             */
            oldflags = ctxt->flags;
            ctxt->flags |= XML_RELAXNG_IN_EXTERNALREF;
            docu->schema = xmlRelaxNGParseDocument(ctxt, root);
            ctxt->flags = oldflags;
            if ((docu->schema != NULL) &&
                (docu->schema->topgrammar != NULL)) {
                docu->content = docu->schema->topgrammar->start;
                if (docu->schema->topgrammar->refs)
                    xmlRelaxNGParseImportRefs(ctxt, docu->schema->topgrammar);
            }

            /*
             * the externalRef may be reused in a different ns context
             */
            if (newNs == 1) {
                xmlUnsetProp(root, BAD_CAST "ns");
            }
        }
        def->content = docu->content;
    } else {
        def = NULL;
    }
    return (def);
}